

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmGlobalNinjaGenerator::NinjaOutputPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  pointer pcVar1;
  bool bVar2;
  
  if (((this->OutputPathPrefix)._M_string_length != 0) &&
     (bVar2 = cmsys::SystemTools::FileIsFullPath(path), !bVar2)) {
    std::operator+(__return_storage_ptr__,&this->OutputPathPrefix,path);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::NinjaOutputPath(
  std::string const& path) const
{
  if (!this->HasOutputPathPrefix() || cmSystemTools::FileIsFullPath(path)) {
    return path;
  }
  return this->OutputPathPrefix + path;
}